

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int libssh2_sftp_fstatvfs(LIBSSH2_SFTP_HANDLE *handle,LIBSSH2_SFTP_STATVFS *st)

{
  LIBSSH2_SFTP *sftp;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP_STATVFS *pLVar1;
  uint32_t uVar2;
  int iVar3;
  ulong buflen;
  uchar *buf;
  ulong uVar4;
  libssh2_uint64_t lVar5;
  libssh2_uint64_t lVar6;
  LIBSSH2_SESSION *pLVar7;
  uchar *s;
  size_t data_len;
  char *pcVar8;
  uchar *local_60;
  uchar *local_58;
  LIBSSH2_SESSION *local_50;
  LIBSSH2_SFTP_STATVFS *local_48;
  char *local_40;
  time_t local_38;
  
  iVar3 = -0x27;
  if (st != (LIBSSH2_SFTP_STATVFS *)0x0 && handle != (LIBSSH2_SFTP_HANDLE *)0x0) {
    local_48 = st;
    local_38 = time((time_t *)0x0);
    local_40 = handle->handle;
    do {
      sftp = handle->sftp;
      channel = sftp->channel;
      pLVar7 = channel->session;
      local_58 = (uchar *)0x0;
      iVar3 = (int)handle->handle_len;
      buflen = (ulong)(iVar3 + 0x25);
      pcVar8 = (char *)0x0;
      if (sftp->fstatvfs_state == libssh2_NB_state_created) {
        buf = sftp->fstatvfs_packet;
        local_50 = pLVar7;
LAB_0012525f:
        uVar4 = _libssh2_channel_write(channel,0,buf,buflen);
        pLVar7 = local_50;
        if (uVar4 != 0xffffffffffffffdb && buflen <= uVar4) {
          (*local_50->free)(buf,&local_50->abstract);
          sftp->fstatvfs_packet = (uchar *)0x0;
          if (-1 < (long)uVar4) {
            sftp->fstatvfs_state = libssh2_NB_state_sent;
            goto LAB_001252bb;
          }
          sftp->fstatvfs_state = libssh2_NB_state_idle;
          iVar3 = -7;
          pcVar8 = "_libssh2_channel_write() failed";
          goto LAB_001253be;
        }
        sftp->fstatvfs_packet = buf;
      }
      else {
        if (sftp->fstatvfs_state == libssh2_NB_state_idle) {
          sftp->last_errno = 0;
          buf = (uchar *)(*pLVar7->alloc)(buflen,&pLVar7->abstract);
          if (buf != (uchar *)0x0) {
            local_60 = buf;
            local_50 = pLVar7;
            _libssh2_store_u32(&local_60,iVar3 + 0x21);
            *local_60 = 200;
            uVar2 = sftp->request_id;
            sftp->request_id = uVar2 + 1;
            sftp->fstatvfs_request_id = uVar2;
            local_60 = local_60 + 1;
            _libssh2_store_u32(&local_60,uVar2);
            _libssh2_store_str(&local_60,"fstatvfs@openssh.com",0x14);
            _libssh2_store_str(&local_60,local_40,handle->handle_len);
            sftp->fstatvfs_state = libssh2_NB_state_created;
            goto LAB_0012525f;
          }
          iVar3 = -6;
          pcVar8 = "Unable to allocate memory for FXP_EXTENDED packet";
          local_60 = (uchar *)0x0;
        }
        else {
LAB_001252bb:
          iVar3 = sftp_packet_requirev
                            (sftp,0x1319f0,(uchar *)(ulong)sftp->fstatvfs_request_id,
                             (uint32_t)&stack0xffffffffffffff98,&local_58,(size_t *)0x9,
                             (size_t)pcVar8);
          if (iVar3 == 0) {
            if (*pcVar8 == 'e') {
              uVar2 = _libssh2_ntohu32((uchar *)(pcVar8 + 5));
              sftp->fstatvfs_state = libssh2_NB_state_idle;
              (*pLVar7->free)(pcVar8,&pLVar7->abstract);
              sftp->last_errno = uVar2;
              iVar3 = -0x1f;
              pcVar8 = "SFTP Protocol Error";
            }
            else {
              if ((uchar *)0x5c < local_58) {
                sftp->fstatvfs_state = libssh2_NB_state_idle;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 5));
                pLVar1 = local_48;
                local_48->f_bsize = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0xd));
                pLVar1->f_frsize = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x15));
                pLVar1->f_blocks = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x1d));
                pLVar1->f_bfree = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x25));
                pLVar1->f_bavail = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x2d));
                pLVar1->f_files = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x35));
                pLVar1->f_ffree = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x3d));
                pLVar1->f_favail = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x45));
                pLVar1->f_fsid = lVar5;
                lVar5 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x4d));
                lVar6 = _libssh2_ntohu64((uchar *)(pcVar8 + 0x55));
                pLVar1->f_namemax = lVar6;
                pLVar1->f_flag = (ulong)((uint)lVar5 & 3);
                (*pLVar7->free)(pcVar8,&pLVar7->abstract);
                return 0;
              }
              (*pLVar7->free)(pcVar8,&pLVar7->abstract);
              sftp->fstatvfs_state = libssh2_NB_state_idle;
              iVar3 = -0x1f;
              pcVar8 = "SFTP Protocol Error: short response";
            }
          }
          else {
            if (iVar3 == -0x25) goto LAB_001253c8;
            if (iVar3 == -0x26) {
              if (local_58 != (uchar *)0x0) {
                (*pLVar7->free)(pcVar8,&pLVar7->abstract);
              }
              iVar3 = -0x1f;
              pcVar8 = "SFTP rename packet too short";
            }
            else {
              sftp->fstatvfs_state = libssh2_NB_state_idle;
              pcVar8 = "Error waiting for FXP EXTENDED REPLY";
            }
          }
        }
LAB_001253be:
        iVar3 = _libssh2_error(pLVar7,iVar3,pcVar8);
        if (iVar3 != -0x25) {
          return iVar3;
        }
      }
LAB_001253c8:
      pLVar7 = handle->sftp->channel->session;
      if (pLVar7->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar7,local_38);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

static int sftp_fstatvfs(LIBSSH2_SFTP_HANDLE *handle, LIBSSH2_SFTP_STATVFS *st)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 17 = packet_len(4) + packet_type(1) + request_id(4) + ext_len(4)
       + handle_len (4) */
    /* 20 = strlen ("fstatvfs@openssh.com") */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 20 + 17);
    unsigned char *packet, *s, *data = NULL;
    ssize_t rc;
    unsigned int flag;
    static const unsigned char responses[2] =
        { SSH_FXP_EXTENDED_REPLY, SSH_FXP_STATUS };

    if(sftp->fstatvfs_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Getting file system statistics"));
        s = packet = LIBSSH2_ALLOC(session, packet_len);
        if(!packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_EXTENDED "
                                  "packet");
        }

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = SSH_FXP_EXTENDED;
        sftp->fstatvfs_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->fstatvfs_request_id);
        _libssh2_store_str(&s, "fstatvfs@openssh.com", 20);
        _libssh2_store_str(&s, handle->handle, handle->handle_len);

        sftp->fstatvfs_state = libssh2_NB_state_created;
    }
    else {
        packet = sftp->fstatvfs_packet;
    }

    if(sftp->fstatvfs_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, packet, packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN ||
            (0 <= rc && rc < (ssize_t)packet_len)) {
            sftp->fstatvfs_packet = packet;
            return LIBSSH2_ERROR_EAGAIN;
        }

        LIBSSH2_FREE(session, packet);
        sftp->fstatvfs_packet = NULL;

        if(rc < 0) {
            sftp->fstatvfs_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "_libssh2_channel_write() failed");
        }
        sftp->fstatvfs_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_requirev(sftp, 2, responses, sftp->fstatvfs_request_id,
                              &data, &data_len, 9);

    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return (int)rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP rename packet too short");
    }
    else if(rc) {
        sftp->fstatvfs_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)rc,
                              "Error waiting for FXP EXTENDED REPLY");
    }

    if(data[0] == SSH_FXP_STATUS) {
        uint32_t retcode = _libssh2_ntohu32(data + 5);
        sftp->fstatvfs_state = libssh2_NB_state_idle;
        LIBSSH2_FREE(session, data);
        sftp->last_errno = retcode;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error");
    }

    if(data_len < 93) {
        LIBSSH2_FREE(session, data);
        sftp->fstatvfs_state = libssh2_NB_state_idle;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error: short response");
    }

    sftp->fstatvfs_state = libssh2_NB_state_idle;

    st->f_bsize = _libssh2_ntohu64(data + 5);
    st->f_frsize = _libssh2_ntohu64(data + 13);
    st->f_blocks = _libssh2_ntohu64(data + 21);
    st->f_bfree = _libssh2_ntohu64(data + 29);
    st->f_bavail = _libssh2_ntohu64(data + 37);
    st->f_files = _libssh2_ntohu64(data + 45);
    st->f_ffree = _libssh2_ntohu64(data + 53);
    st->f_favail = _libssh2_ntohu64(data + 61);
    st->f_fsid = _libssh2_ntohu64(data + 69);
    flag = (unsigned int)_libssh2_ntohu64(data + 77);
    st->f_namemax = _libssh2_ntohu64(data + 85);

    st->f_flag = (flag & SSH_FXE_STATVFS_ST_RDONLY)
        ? LIBSSH2_SFTP_ST_RDONLY : 0;
    st->f_flag |= (flag & SSH_FXE_STATVFS_ST_NOSUID)
        ? LIBSSH2_SFTP_ST_NOSUID : 0;

    LIBSSH2_FREE(session, data);
    return 0;
}